

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  ConstPixelBufferAccess *this;
  bool bVar1;
  int px;
  int y;
  ulong uVar2;
  Vec3 *s;
  int lodOffsNdx;
  long lVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float width;
  float height;
  Texture1DArrayView TVar9;
  Vec2 lodBias;
  Vec2 coord;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triT [2];
  Vec3 triS [2];
  Texture1DArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodO;
  Vec2 clampedLod;
  float local_1c4;
  Vector<float,_2> local_1b0;
  int local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  ReferenceParams *local_190;
  ulong local_188;
  Vec2 local_180;
  float local_174;
  float local_170;
  float local_16c;
  PixelBufferAccess *local_168;
  ConstPixelBufferAccess *local_160;
  ConstPixelBufferAccess *local_158;
  Vec4 *local_150;
  Vec4 *local_148;
  Vector<float,_2> local_140;
  undefined1 local_138 [16];
  Vector<float,_4> local_128;
  Vec4 local_118;
  Vec3 local_108;
  float local_fc;
  float local_f8;
  float local_f4;
  Vec3 local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  Sampler *local_c8;
  Vec4 *local_c0;
  Texture1DArrayView local_b8;
  float local_a8 [8];
  Vec3 local_88;
  float fStack_7c;
  undefined8 local_78;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  local_68 [2];
  undefined1 local_38 [8];
  
  local_68[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = &sampleParams->sampler;
  local_190 = sampleParams;
  local_168 = errorMask;
  TVar9 = tcu::getEffectiveTextureView
                    (baseView,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               *)local_68,local_c8);
  local_b8.m_levels = TVar9.m_levels;
  local_b8.m_numLevels = TVar9.m_numLevels;
  local_e8.m_data[0] = *texCoord;
  local_108.m_data[0] = texCoord[1];
  local_e8.m_data[1] = texCoord[2];
  local_e8.m_data[2] = texCoord[4];
  local_dc = texCoord[6];
  local_108.m_data[1] = texCoord[3];
  local_108.m_data[2] = texCoord[5];
  local_fc = texCoord[7];
  local_140.m_data[0] = 0.0;
  local_1c4 = 0.0;
  if (0 < local_b8.m_numLevels) {
    local_1c4 = (float)((local_b8.m_levels)->m_size).m_data[0];
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_88.m_data[0] = (local_190->super_RenderParams).w.m_data[0];
  local_88.m_data[1] = (local_190->super_RenderParams).w.m_data[1];
  local_88.m_data[2] = (local_190->super_RenderParams).w.m_data[2];
  fStack_7c = (local_190->super_RenderParams).w.m_data[3];
  local_78 = CONCAT44(local_88.m_data[1],local_88.m_data[2]);
  if (((local_190->super_RenderParams).flags & 2) != 0) {
    local_140.m_data[0] = (local_190->super_RenderParams).bias;
  }
  local_a8[0] = -1.0;
  local_a8[1] = 0.0;
  local_a8[2] = 1.0;
  local_a8[3] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = -1.0;
  local_a8[6] = 0.0;
  local_a8[7] = 1.0;
  local_128.m_data[0] = -1.7146522e+38;
  local_140.m_data[1] = local_140.m_data[0];
  local_f8 = local_108.m_data[2];
  local_f4 = local_108.m_data[1];
  local_d8 = local_e8.m_data[2];
  local_d4 = local_e8.m_data[1];
  tcu::RGBA::toVec((RGBA *)&local_128);
  tcu::clear(local_168,&local_118);
  local_148 = &(local_190->super_RenderParams).colorBias;
  local_150 = &(local_190->super_RenderParams).colorScale;
  local_c0 = &lookupPrec->colorThreshold;
  this = (ConstPixelBufferAccess *)&local_68[1]._M_impl.super__Vector_impl_data._M_finish;
  local_1a4 = 0;
  uVar2 = 0;
  local_160 = result;
  local_158 = reference;
  while ((int)uVar2 < (result->m_size).m_data[1]) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    local_19c = (float)(int)uVar2 + 0.5;
    local_1a0 = local_19c / height;
    local_170 = height - local_19c;
    local_174 = 1.0 - local_1a0;
    local_188 = uVar2;
    for (y = 0; y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel(this,(int)result,y,(int)local_188);
      tcu::operator-((tcu *)&local_128,(Vector<float,_4> *)this,local_148);
      tcu::operator/((tcu *)&local_118,&local_128,local_150);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_138,(int)reference,y,(int)local_188);
      tcu::operator-((tcu *)this,(Vector<float,_4> *)local_138,local_148);
      tcu::operator/((tcu *)&local_128,(Vector<float,_4> *)this,local_150);
      tcu::operator-((tcu *)local_138,&local_118,&local_128);
      tcu::abs<float,4>((tcu *)this,(Vector<float,_4> *)local_138);
      tcu::lessThanEqual<float,4>((tcu *)&local_1b0,(Vector<float,_4> *)this,local_c0);
      bVar1 = tcu::boolAll<4>((Vector<bool,_4> *)&local_1b0);
      if (!bVar1) {
        fVar8 = (float)y + 0.5;
        fVar7 = fVar8 / width;
        bVar1 = 1.0 <= local_1a0 + fVar7;
        fVar6 = local_1a0;
        local_194 = fVar8;
        local_198 = local_19c;
        if (bVar1) {
          fVar7 = 1.0 - fVar7;
          fVar6 = local_174;
          local_194 = width - fVar8;
          local_198 = local_170;
        }
        s = &local_e8 + bVar1;
        w = &local_88 + bVar1;
        local_16c = projectedTriInterpolate(s,w,fVar7,fVar6);
        local_138._4_4_ = projectedTriInterpolate(&local_108 + bVar1,w,fVar7,fVar6);
        local_138._0_4_ = local_16c;
        fVar6 = triDerivateX(s,w,fVar8,width,fVar6);
        fVar7 = triDerivateY(s,w,local_19c,height,fVar7);
        tcu::computeLodBoundsFromDerivates
                  ((tcu *)&local_1b0,fVar6 * local_1c4,fVar7 * local_1c4,lodPrec);
        for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
          fVar6 = local_a8[lVar3 * 2] + local_194;
          fVar8 = local_a8[lVar3 * 2 + 1] + local_198;
          fVar7 = triDerivateX(s,w,fVar6,width,fVar8 / height);
          fVar6 = triDerivateY(s,w,fVar8,height,fVar6 / width);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)this,fVar7 * local_1c4,fVar6 * local_1c4,lodPrec);
          fVar6 = (float)((ulong)local_68[1]._M_impl.super__Vector_impl_data._M_finish >> 0x20);
          uVar4 = -(uint)(local_1b0.m_data[0] <=
                         SUB84(local_68[1]._M_impl.super__Vector_impl_data._M_finish,0));
          uVar5 = -(uint)(fVar6 <= local_1b0.m_data[1]);
          local_1b0.m_data[0] =
               (float)(~uVar4 & (uint)SUB84(local_68[1]._M_impl.super__Vector_impl_data._M_finish,0)
                      | (uint)local_1b0.m_data[0] & uVar4);
          local_1b0.m_data[1] = (float)(~uVar5 & (uint)fVar6 | (uint)local_1b0.m_data[1] & uVar5);
        }
        tcu::operator+(&local_1b0,&local_140);
        local_180.m_data[0] = local_190->minLod;
        local_180.m_data[1] = local_190->maxLod;
        tcu::clampLodBounds((tcu *)local_38,(Vec2 *)this,&local_180,lodPrec);
        bVar1 = tcu::isLookupResultValid
                          (&local_b8,local_c8,lookupPrec,(Vec2 *)local_138,(Vec2 *)local_38,
                           &local_118);
        reference = local_158;
        result = local_160;
        if (!bVar1) {
          local_180.m_data[0] = -1.7014636e+38;
          tcu::RGBA::toVec((RGBA *)&local_180);
          reference = local_158;
          result = local_160;
          tcu::PixelBufferAccess::setPixel(local_168,(Vec4 *)this,y,(int)local_188,0);
          local_1a4 = local_1a4 + 1;
        }
      }
    }
    uVar2 = (ulong)((int)local_188 + 1);
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(local_68);
  return local_1a4;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const float									srcSize				= float(src.getWidth()); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord	(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
										 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const float	coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * srcSize;
				const float	coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo		= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * srcSize;
					const float	coordDyo		= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}